

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

size_t __thiscall
edition_unittest::TestNestedRequiredForeign::ByteSizeLong(TestNestedRequiredForeign *this)

{
  int iVar1;
  long lVar2;
  anon_union_64_1_493b367e_for_TestNestedRequiredForeign_3 aVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  
  aVar3 = this->field_0;
  if (((undefined1  [64])aVar3 & (undefined1  [64])0x7f) == (undefined1  [64])0x0) {
    sVar7 = 0;
  }
  else {
    if (((undefined1  [64])aVar3 & (undefined1  [64])0x1) == (undefined1  [64])0x0) {
      sVar7 = 0;
    }
    else {
      sVar7 = ByteSizeLong((this->field_0)._impl_.child_);
      uVar4 = (uint)sVar7 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + (iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [64])aVar3 & (undefined1  [64])0x2) != (undefined1  [64])0x0) {
      sVar5 = TestRequiredForeign::ByteSizeLong((this->field_0)._impl_.payload_);
      uVar4 = (uint)sVar5 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [64])aVar3 & (undefined1  [64])0x4) != (undefined1  [64])0x0) {
      sVar5 = TestRequiredEnum::ByteSizeLong((this->field_0)._impl_.required_enum_);
      uVar4 = (uint)sVar5 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [64])aVar3 & (undefined1  [64])0x8) != (undefined1  [64])0x0) {
      sVar5 = TestRequiredEnumNoMask::ByteSizeLong((this->field_0)._impl_.required_enum_no_mask_);
      uVar4 = (uint)sVar5 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [64])aVar3 & (undefined1  [64])0x10) != (undefined1  [64])0x0) {
      sVar5 = TestRequiredEnumMulti::ByteSizeLong((this->field_0)._impl_.required_enum_multi_);
      uVar4 = (uint)sVar5 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [64])aVar3 & (undefined1  [64])0x20) != (undefined1  [64])0x0) {
      sVar5 = TestRequiredNoMaskMulti::ByteSizeLong((this->field_0)._impl_.required_no_mask_);
      uVar4 = (uint)sVar5 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [64])aVar3 & (undefined1  [64])0x40) != (undefined1  [64])0x0) {
      uVar6 = (long)(this->field_0)._impl_.dummy_ | 1;
      lVar2 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
  }
  sVar7 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar7,&(this->field_0)._impl_._cached_size_);
  return sVar7;
}

Assistant:

::size_t TestNestedRequiredForeign::ByteSizeLong() const {
  const TestNestedRequiredForeign& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestNestedRequiredForeign)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000007fu) != 0) {
    // .edition_unittest.TestNestedRequiredForeign child = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.child_);
    }
    // .edition_unittest.TestRequiredForeign payload = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.payload_);
    }
    // .edition_unittest.TestRequiredEnum required_enum = 5;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.required_enum_);
    }
    // .edition_unittest.TestRequiredEnumNoMask required_enum_no_mask = 6;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.required_enum_no_mask_);
    }
    // .edition_unittest.TestRequiredEnumMulti required_enum_multi = 7;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.required_enum_multi_);
    }
    // .edition_unittest.TestRequiredNoMaskMulti required_no_mask = 9;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.required_no_mask_);
    }
    // int32 dummy = 3;
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_dummy());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}